

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

int CfdRipemd160(void *handle,char *message,bool has_text,char **output)

{
  char *pcVar1;
  CfdException *pCVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  allocator local_91;
  undefined1 local_90 [32];
  ByteData160 data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  cfd::Initialize();
  if (message == (char *)0x0) {
    local_90._0_8_ = "cfdcapi_common.cpp";
    local_90._8_4_ = 0x3af;
    local_90._16_8_ = "CfdRipemd160";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"message is null.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_90,"Failed to parameter. message is null.",(allocator *)&data);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_90);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output != (char **)0x0) {
    cfd::core::ByteData160::ByteData160(&data);
    if (has_text) {
      std::__cxx11::string::string((string *)local_90,message,(allocator *)&local_58);
      cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_40,(string *)local_90);
      this = &local_40;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,this);
    }
    else {
      std::__cxx11::string::string((string *)local_90,message,&local_91);
      cfd::core::ByteData::ByteData((ByteData *)&local_58,(string *)local_90);
      cfd::core::HashUtil::Ripemd160((ByteData160 *)&local_40,(ByteData *)&local_58);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&data,&local_40);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
      this = &local_58;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this);
    std::__cxx11::string::~string((string *)local_90);
    cfd::core::ByteData160::GetHex_abi_cxx11_((string *)local_90,&data);
    pcVar1 = cfd::capi::CreateString((string *)local_90);
    *output = pcVar1;
    std::__cxx11::string::~string((string *)local_90);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
    return 0;
  }
  local_90._0_8_ = "cfdcapi_common.cpp";
  local_90._8_4_ = 0x3b5;
  local_90._16_8_ = "CfdRipemd160";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_90,"output is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_90,"Failed to parameter. output is null.",(allocator *)&data);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_90);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdRipemd160(
    void* handle, const char* message, bool has_text, char** output) {
  try {
    cfd::Initialize();
    if (message == nullptr) {
      warn(CFD_LOG_SOURCE, "message is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. message is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }

    cfd::core::ByteData160 data;
    if (has_text) {
      data = cfd::core::HashUtil::Ripemd160(std::string(message));
    } else {
      data = cfd::core::HashUtil::Ripemd160(ByteData(message));
    }
    *output = cfd::capi::CreateString(data.GetHex());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}